

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O3

void m2v_multadd_row(m2v *M1,int r1,int alpha,m2v *Mt,int rt)

{
  int iVar1;
  int iVar2;
  m2v_base *pmVar3;
  m2v_base *pmVar4;
  long lVar5;
  
  if ((alpha != 0) && (iVar1 = Mt->row_stride, 0 < iVar1)) {
    iVar2 = M1->row_stride;
    pmVar3 = M1->e;
    pmVar4 = Mt->e;
    lVar5 = 0;
    do {
      pmVar4[iVar1 * rt + lVar5] =
           pmVar4[iVar1 * rt + lVar5] ^ pmVar3[(long)r1 * (long)iVar2 + lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 < Mt->row_stride);
  }
  return;
}

Assistant:

void m2v_multadd_row(const m2v* M1,
			int r1,
			int alpha,
			m2v* Mt,
			int rt)
{
	assert(M1->n_col == Mt->n_col);
	assert(0 <= r1 && r1 < M1->n_row);
	assert(0 <= rt && rt < Mt->n_row);
	if (alpha == 0)
		return;

	const int o1 = get_word(M1, r1, 0);
	const int ot = get_word(Mt, rt, 0);
	for (int i = 0; i < Mt->row_stride; ++i) {
		Mt->e[ot + i] ^= M1->e[o1 + i];
	}
}